

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnit.cpp
# Opt level: O2

void __thiscall celero::JUnit::save(JUnit *this)

{
  _Tuple_impl<0UL,_celero::JUnit::Impl_*,_std::default_delete<celero::JUnit::Impl>_> _Var1;
  pointer psVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  Experiment *pEVar6;
  uint64_t uVar7;
  _Rb_tree_node_base *p_Var8;
  __shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  char *pcVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  shared_ptr<celero::ExperimentResult> j_1;
  vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
  runs;
  shared_ptr<celero::ExperimentResult> j;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
  i;
  ofstream ofs;
  
  std::ofstream::ofstream((string *)&ofs);
  std::ofstream::open((string *)&ofs,
                      (_Ios_Openmode)
                      (Impl *)(this->pimpl)._pimpl._M_t.
                              super___uniq_ptr_impl<celero::JUnit::Impl,_std::default_delete<celero::JUnit::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_celero::JUnit::Impl_*,_std::default_delete<celero::JUnit::Impl>_>
                              .super__Head_base<0UL,_celero::JUnit::Impl_*,_false>);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    poVar5 = std::operator<<((ostream *)&ofs,"<?xml version=\"1.0\" encoding=\"UTF-8\" ?>");
    std::endl<char,std::char_traits<char>>(poVar5);
    _Var1.super__Head_base<0UL,_celero::JUnit::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::JUnit::Impl,_std::default_delete<celero::JUnit::Impl>_>._M_t.
         super__Tuple_impl<0UL,_celero::JUnit::Impl_*,_std::default_delete<celero::JUnit::Impl>_>.
         super__Head_base<0UL,_celero::JUnit::Impl_*,_false>;
    for (p_Var8 = *(_Rb_tree_node_base **)
                   ((long)_Var1.super__Head_base<0UL,_celero::JUnit::Impl_*,_false>._M_head_impl +
                   0x38);
        p_Var8 != (_Rb_tree_node_base *)
                  ((long)_Var1.super__Head_base<0UL,_celero::JUnit::Impl_*,_false>._M_head_impl +
                  0x28); p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
      ::pair(&i,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
                 *)(p_Var8 + 1));
      std::
      vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
      ::vector(&runs,&i.second);
      psVar2 = runs.
               super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = 0;
      for (p_Var9 = &(runs.
                      super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>;
          p_Var9 != &psVar2->
                     super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>;
          p_Var9 = p_Var9 + 1) {
        std::__shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2> *)&j,p_Var9);
        bVar4 = ExperimentResult::getFailure
                          (j.
                           super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (!bVar4) {
          pEVar6 = ExperimentResult::getExperiment
                             (j.
                              super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
          dVar12 = Experiment::getBaselineTarget(pEVar6);
          if (0.0 < dVar12) {
            ExperimentResult::getBaselineMeasurement
                      (j.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            pEVar6 = ExperimentResult::getExperiment
                               (j.
                                super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            Experiment::getBaselineTarget(pEVar6);
          }
          uVar7 = ExperimentResult::getRunTime
                            (j.
                             super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          lVar11 = lVar11 + uVar7;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      poVar5 = std::operator<<((ostream *)&ofs,"<testsuite errors=\"");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"\" ");
      poVar5 = std::operator<<((ostream *)&ofs,"tests=\"");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"\" ");
      std::operator<<((ostream *)&ofs,"time=\"");
      auVar14._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar14._0_8_ = lVar11;
      auVar14._12_4_ = 0x45300000;
      poVar5 = std::ostream::_M_insert<double>
                         (((auVar14._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) * 1e-06);
      std::operator<<(poVar5,"\" ");
      poVar5 = std::operator<<((ostream *)&ofs,"failures=\"");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"\" ");
      poVar5 = std::operator<<((ostream *)&ofs,"name=\"");
      poVar5 = std::operator<<(poVar5,(string *)&i);
      poVar5 = std::operator<<(poVar5,"\">");
      std::endl<char,std::char_traits<char>>(poVar5);
      psVar2 = runs.
               super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var9 = &(runs.
                      super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>;
          p_Var9 != &psVar2->
                     super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>;
          p_Var9 = p_Var9 + 1) {
        std::__shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&j_1.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>,
                   p_Var9);
        std::operator<<((ostream *)&ofs,"\t<testcase ");
        std::operator<<((ostream *)&ofs,"time=\"");
        bVar4 = ExperimentResult::getFailure
                          (j_1.
                           super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (bVar4) {
          uVar7 = 0;
        }
        else {
          uVar7 = ExperimentResult::getRunTime
                            (j_1.
                             super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        }
        auVar15._8_4_ = (int)(uVar7 >> 0x20);
        auVar15._0_8_ = uVar7;
        auVar15._12_4_ = 0x45300000;
        poVar5 = std::ostream::_M_insert<double>
                           (((auVar15._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1e-06)
        ;
        std::operator<<(poVar5,"\" ");
        poVar5 = std::operator<<((ostream *)&ofs,"name=\"");
        pEVar6 = ExperimentResult::getExperiment
                           (j_1.
                            super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        Experiment::getName_abi_cxx11_((string *)&j,pEVar6);
        poVar5 = std::operator<<(poVar5,(string *)&j);
        poVar5 = std::operator<<(poVar5,"#");
        ExperimentResult::getProblemSpaceValue
                  (j_1.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::operator<<(poVar5,"\"");
        std::__cxx11::string::~string((string *)&j);
        bVar4 = ExperimentResult::getFailure
                          (j_1.
                           super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (bVar4) {
          poVar5 = std::operator<<((ostream *)&ofs,">");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::operator<<((ostream *)&ofs,"\t\t<error ");
          pcVar10 = "type=\"exception\"";
          poVar5 = (ostream *)&ofs;
LAB_00138c67:
          std::operator<<(poVar5,pcVar10);
          poVar5 = std::operator<<((ostream *)&ofs,"/>");
          std::endl<char,std::char_traits<char>>(poVar5);
          pcVar10 = "\t</testcase>";
        }
        else {
          pEVar6 = ExperimentResult::getExperiment
                             (j_1.
                              super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
          dVar12 = Experiment::getBaselineTarget(pEVar6);
          pcVar10 = "/>";
          if (0.0 < dVar12) {
            dVar12 = ExperimentResult::getBaselineMeasurement
                               (j_1.
                                super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            pEVar6 = ExperimentResult::getExperiment
                               (j_1.
                                super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            dVar13 = Experiment::getBaselineTarget(pEVar6);
            pcVar10 = "/>";
            if (dVar13 < dVar12) {
              poVar5 = std::operator<<((ostream *)&ofs,">");
              std::endl<char,std::char_traits<char>>(poVar5);
              std::operator<<((ostream *)&ofs,"\t\t<failure ");
              std::operator<<((ostream *)&ofs,"type=\"Performance objective not met.\" ");
              std::operator<<((ostream *)&ofs,"message=\"Measurement of ");
              dVar12 = ExperimentResult::getBaselineMeasurement
                                 (j_1.
                                  super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
              poVar5 = std::ostream::_M_insert<double>(dVar12);
              std::operator<<(poVar5," exceeds objective baseline of ");
              pEVar6 = ExperimentResult::getExperiment
                                 (j_1.
                                  super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
              dVar12 = Experiment::getBaselineTarget(pEVar6);
              poVar5 = std::ostream::_M_insert<double>(dVar12);
              pcVar10 = "\" ";
              goto LAB_00138c67;
            }
          }
        }
        poVar5 = std::operator<<((ostream *)&ofs,pcVar10);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_1.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      poVar5 = std::operator<<((ostream *)&ofs,"</testsuite>");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::
      vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
      ::~vector(&runs);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
      ::~pair(&i);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void JUnit::save()
{
	std::ofstream ofs;
	ofs.open(this->pimpl->fileName);

	if(ofs.is_open() == true)
	{
		const auto os = &ofs;

		*os << "<?xml version=\"1.0\" encoding=\"UTF-8\" ?>" << std::endl;

		for(auto i : this->pimpl->results)
		{
			uint64_t testSuiteTime = 0;
			size_t testSuiteFailures = 0;
			size_t testSuiteErrors = 0;

			const auto runs = i.second;

			for(auto j : runs)
			{
				if(j->getFailure())
				{
					testSuiteErrors++;
					continue;
				}
				else if((j->getExperiment()->getBaselineTarget() > 0.0) && (j->getBaselineMeasurement() > j->getExperiment()->getBaselineTarget()))
				{
					testSuiteFailures++;
				}

				testSuiteTime += j->getRunTime();
			}

			*os << "<testsuite errors=\"" << testSuiteErrors << "\" ";
			*os << "tests=\"" << i.second.size() << "\" ";
			*os << "time=\"" << celero::timer::ConvertSystemTime(testSuiteTime) << "\" ";
			*os << "failures=\"" << testSuiteFailures << "\" ";
			*os << "name=\"" << i.first << "\">" << std::endl;

			for(auto j : runs)
			{
				*os << "\t<testcase ";
				*os << "time=\"" << celero::timer::ConvertSystemTime(j->getFailure() ? 0 : j->getRunTime()) << "\" ";
				*os << "name=\"" << j->getExperiment()->getName() << "#" << j->getProblemSpaceValue() << "\"";

				// Compare measured to objective
				if(j->getFailure())
				{
					// Error
					*os << ">" << std::endl;

					*os << "\t\t<error ";
					*os << "type=\"exception\"";
					*os << "/>" << std::endl;

					*os << "\t</testcase>" << std::endl;
				}
				else if((j->getExperiment()->getBaselineTarget() > 0.0) && (j->getBaselineMeasurement() > j->getExperiment()->getBaselineTarget()))
				{
					// Failure
					*os << ">" << std::endl;

					*os << "\t\t<failure ";
					*os << "type=\"Performance objective not met.\" ";
					*os << "message=\"Measurement of " << j->getBaselineMeasurement() << " exceeds objective baseline of "
						<< j->getExperiment()->getBaselineTarget() << "\" ";
					*os << "/>" << std::endl;

					*os << "\t</testcase>" << std::endl;
				}
				else
				{
					// Success
					*os << "/>" << std::endl;
				}
			}

			*os << "</testsuite>" << std::endl;
		}

		ofs.close();
	}
}